

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XercesXPath.cpp
# Opt level: O0

XMLSize_t __thiscall
xercesc_4_0::XPathScanner::scanNCName
          (XPathScanner *this,XMLCh *data,XMLSize_t endOffset,XMLSize_t currentOffset)

{
  bool bVar1;
  XPathScanner *pXStack_30;
  XMLCh ch;
  XMLSize_t currentOffset_local;
  XMLSize_t endOffset_local;
  XMLCh *data_local;
  XPathScanner *this_local;
  
  bVar1 = XMLChar1_0::isFirstNCNameChar(data[currentOffset],L'\0');
  pXStack_30 = (XPathScanner *)currentOffset;
  this_local = (XPathScanner *)currentOffset;
  if (bVar1) {
    do {
      pXStack_30 = (XPathScanner *)((long)&pXStack_30->_vptr_XPathScanner + 1);
      if (endOffset <= pXStack_30) {
        return (XMLSize_t)pXStack_30;
      }
      bVar1 = XMLChar1_0::isNCNameChar(data[(long)pXStack_30],L'\0');
      this_local = pXStack_30;
    } while (bVar1);
  }
  return (XMLSize_t)this_local;
}

Assistant:

XMLSize_t XPathScanner::scanNCName(const XMLCh* const data,
                             const XMLSize_t endOffset,
                             XMLSize_t currentOffset) {

    XMLCh ch = data[currentOffset];

    if (!XMLChar1_0::isFirstNCNameChar(ch)) {
        return currentOffset;
    }

    while (++currentOffset < endOffset) {

        ch = data[currentOffset];

        if (!XMLChar1_0::isNCNameChar(ch)) {
            break;
        }
    }

    return currentOffset;
}